

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.cpp
# Opt level: O2

int luaK_codek(FuncState *fs,int reg,int k)

{
  int iVar1;
  
  if (k < 0x40000) {
    iVar1 = luaK_codeABx(fs,OP_LOADK,reg,k);
    return iVar1;
  }
  iVar1 = luaK_code(fs,reg << 6 | 2);
  codeextraarg(fs,k);
  return iVar1;
}

Assistant:

int luaK_codek (FuncState *fs, int reg, int k) {
  if (k <= MAXARG_Bx)
    return luaK_codeABx(fs, OP_LOADK, reg, k);
  else {
    int p = luaK_codeABx(fs, OP_LOADKX, reg, 0);
    codeextraarg(fs, k);
    return p;
  }
}